

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O0

void print_string(string *path,string *value)

{
  ostream *poVar1;
  string *value_local;
  string *path_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)path);
  poVar1 = std::operator<<(poVar1,": string: ");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
print_string(std::string const& path, std::string const& value)
{
    std::cout << path << ": string: " << value << std::endl;
}